

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_daxpy_ie(int n,double alpha,double *x,int incx,double *y,int incy)

{
  ulong uVar1;
  
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x5f,"void la_daxpy_ie(int, double, const double *, int, double *, int)");
  }
  if (y != (double *)0x0) {
    if (x != y) {
      if (0 < n) {
        uVar1 = (ulong)(uint)n;
        do {
          *y = *x * alpha + *y;
          y = y + incy;
          x = x + incx;
          uVar1 = uVar1 - 1;
        } while (uVar1 != 0);
      }
      return;
    }
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x61,"void la_daxpy_ie(int, double, const double *, int, double *, int)");
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x60,"void la_daxpy_ie(int, double, const double *, int, double *, int)");
}

Assistant:

void la_daxpy_ie(
        int n,
        double alpha,
        const double *x, int incx,
        double *y, int incy)
{
    assert(x);
    assert(y);
    assert(x != y);

    for (int i = 0; i < n; i++) {
        y[i * incy] = alpha * x[i * incx] + y[i * incy];
    }
}